

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  bool bVar2;
  stbi_uc sVar3;
  int iVar4;
  uint x_00;
  uint y_00;
  uint uVar5;
  int iVar6;
  stbi_uc *psVar7;
  byte *pbVar8;
  uchar *puVar9;
  stbi_uc *psVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uchar *puVar15;
  char cVar16;
  undefined8 unaff_R12;
  undefined4 uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  uchar raw_data [4];
  stbi_uc local_a4 [4];
  uint *local_a0;
  uint local_94;
  undefined4 local_90;
  uint local_8c;
  uchar *local_88;
  uint local_7c;
  stbi_uc *local_78;
  undefined4 local_70;
  uint local_6c;
  stbi_uc *local_68;
  size_t local_60;
  ulong local_58;
  ulong local_50;
  stbi_uc *local_48;
  uint local_3c;
  ulong local_38;
  
  pbVar8 = s->img_buffer;
  local_a0 = (uint *)y;
  local_3c = req_comp;
  if (pbVar8 < s->img_buffer_end) {
LAB_0012cb90:
    s->img_buffer = pbVar8 + 1;
    local_78 = (stbi_uc *)CONCAT44(local_78._4_4_,(uint)*pbVar8);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar7 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar7;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar7;
        s->img_buffer_end = psVar7 + iVar4;
      }
      pbVar8 = s->img_buffer;
      goto LAB_0012cb90;
    }
    local_78 = (stbi_uc *)((ulong)local_78 & 0xffffffff00000000);
  }
  psVar7 = s->img_buffer;
  if (psVar7 < s->img_buffer_end) {
LAB_0012cc10:
    s->img_buffer = psVar7 + 1;
    uVar17 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),*psVar7 != '\0');
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar7 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar7;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar7;
        s->img_buffer_end = psVar7 + iVar4;
      }
      psVar7 = s->img_buffer;
      goto LAB_0012cc10;
    }
    uVar17 = 0;
  }
  psVar7 = s->img_buffer;
  if (psVar7 < s->img_buffer_end) {
LAB_0012cc95:
    s->img_buffer = psVar7 + 1;
    local_8c = (uint)CONCAT71((int7)((ulong)psVar7 >> 8),*psVar7);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar7 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar7;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar7;
        s->img_buffer_end = psVar7 + iVar4;
      }
      psVar7 = s->img_buffer;
      goto LAB_0012cc95;
    }
    local_8c = 0;
  }
  iVar4 = stbi__get16le(s);
  local_60 = CONCAT44(local_60._4_4_,iVar4);
  local_6c = stbi__get16le(s);
  pbVar8 = s->img_buffer;
  if (pbVar8 < s->img_buffer_end) {
LAB_0012cd2b:
    s->img_buffer = pbVar8 + 1;
    bVar11 = *pbVar8;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar7 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar7;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar7;
        s->img_buffer_end = psVar7 + iVar4;
      }
      pbVar8 = s->img_buffer;
      goto LAB_0012cd2b;
    }
    bVar11 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  y_00 = stbi__get16le(s);
  psVar7 = s->img_buffer;
  local_90 = uVar17;
  if (psVar7 < s->img_buffer_end) {
LAB_0012cde3:
    s->img_buffer = psVar7 + 1;
    local_94 = (uint)CONCAT71((int7)((ulong)psVar7 >> 8),*psVar7);
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar7 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar7;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar7;
        s->img_buffer_end = psVar7 + iVar4;
      }
      psVar7 = s->img_buffer;
      goto LAB_0012cde3;
    }
    local_94 = 0;
  }
  cVar16 = (char)local_90;
  pbVar8 = s->img_buffer;
  if (pbVar8 < s->img_buffer_end) {
LAB_0012ce6c:
    cVar16 = (char)local_90;
    s->img_buffer = pbVar8 + 1;
    bVar22 = (*pbVar8 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar7 = s->buffer_start;
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar7;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar7;
        s->img_buffer_end = psVar7 + iVar4;
      }
      pbVar8 = s->img_buffer;
      goto LAB_0012ce6c;
    }
    bVar22 = true;
  }
  if (cVar16 == '\0') {
    uVar12 = local_94 & 0xff;
    if ((local_94 & 0xff) < 0x10) {
      if ((local_94 & 0xff) != 8) {
        if (uVar12 == 0xf) goto LAB_0012cf0f;
        goto LAB_0012cf37;
      }
LAB_0012cf2d:
      uVar12 = 1;
    }
    else if ((uVar12 == 0x20) || (uVar12 == 0x18)) {
      uVar12 = local_94 >> 3 & 0x1f;
    }
    else {
      if (uVar12 != 0x10) goto LAB_0012cf37;
      uVar12 = (local_8c & 0xff) - 8;
      if ((byte)local_8c < 8) {
        uVar12 = local_8c & 0xff;
      }
      if (uVar12 != 3) goto LAB_0012cf0f;
      uVar12 = uVar12 == 3 ^ 3;
    }
LAB_0012cf32:
    bVar2 = true;
    uVar17 = 0;
  }
  else {
    uVar12 = (uint)bVar11;
    if (uVar12 < 0x18) {
      if (uVar12 - 0xf < 2) {
LAB_0012cf0f:
        uVar12 = 3;
        uVar17 = (undefined4)CONCAT71((uint7)(uint3)(x_00 >> 8),1);
        bVar2 = false;
        goto LAB_0012cf3c;
      }
      if (uVar12 == 8) goto LAB_0012cf2d;
    }
    else if ((uVar12 == 0x18) || (uVar12 == 0x20)) {
      uVar12 = (uint)(bVar11 >> 3);
      goto LAB_0012cf32;
    }
LAB_0012cf37:
    bVar2 = true;
    uVar17 = 0;
    uVar12 = 0;
  }
LAB_0012cf3c:
  if (uVar12 == 0) {
    stbi__g_failure_reason = "bad format";
    return (stbi_uc *)0x0;
  }
  *x = x_00;
  *local_a0 = y_00;
  if (comp != (int *)0x0) {
    *comp = uVar12;
  }
  uVar18 = (ulong)uVar12;
  local_88 = (uchar *)malloc(uVar18 * (y_00 * x_00));
  if (local_88 != (uchar *)0x0) {
    bVar21 = (byte)local_8c < 8;
    local_50 = (ulong)(y_00 * x_00);
    stbi__skip(s,(int)local_78);
    puVar9 = local_88;
    local_a0 = (uint *)CONCAT44(local_a0._4_4_,uVar12);
    local_70 = uVar17;
    local_58 = uVar18;
    if (((char)local_90 == '\0' && (char)uVar17 == '\0') && bVar21) {
      if (y_00 != 0) {
        uVar19 = 0;
        uVar13 = y_00;
        do {
          uVar13 = uVar13 - 1;
          uVar5 = uVar19;
          if (bVar22) {
            uVar5 = uVar13;
          }
          stbi__getn(s,puVar9 + (int)(uVar5 * x_00 * uVar12),x_00 * uVar12);
          uVar19 = uVar19 + 1;
        } while (uVar13 != 0);
      }
    }
    else {
      if ((char)local_90 == '\0') {
        psVar7 = (stbi_uc *)0x0;
      }
      else {
        stbi__skip(s,(int)local_60);
        uVar13 = local_6c;
        uVar19 = uVar12 * local_6c;
        psVar7 = (stbi_uc *)malloc((ulong)uVar19);
        uVar18 = local_58;
        puVar9 = local_88;
        if (psVar7 == (stbi_uc *)0x0) {
          free(local_88);
          goto LAB_0012d49b;
        }
        if (bVar2) {
          iVar4 = stbi__getn(s,psVar7,uVar19);
          puVar9 = local_88;
          if (iVar4 == 0) {
            free(local_88);
            free(psVar7);
            stbi__g_failure_reason = "bad palette";
            return (stbi_uc *)0x0;
          }
        }
        else {
          if (uVar12 != 3) {
            __assert_fail("tga_comp == STBI_rgb",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/stb_image.h"
                          ,0x1434,
                          "stbi_uc *stbi__tga_load(stbi__context *, int *, int *, int *, int)");
          }
          if (uVar13 != 0) {
            psVar10 = psVar7 + 2;
            local_68 = psVar7;
            do {
              uVar12 = stbi__get16le(s);
              psVar10[-2] = (stbi_uc)((ulong)((uVar12 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              psVar10[-1] = (stbi_uc)((ulong)((uVar12 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              *psVar10 = (stbi_uc)((ulong)((uVar12 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              psVar10 = psVar10 + uVar18;
              uVar13 = uVar13 - 1;
              psVar7 = local_68;
            } while (uVar13 != 0);
          }
        }
      }
      local_68 = psVar7;
      if ((int)local_50 != 0) {
        psVar7 = s->buffer_start;
        uVar12 = (uint)local_a0 + ((uint)local_a0 == 0);
        local_60 = local_58 + (local_58 == 0);
        local_48 = s->buffer_start + 1;
        local_38 = local_50 & 0xffffffff;
        uVar18 = 0;
        bVar11 = 0;
        local_7c = 0;
        iVar4 = 0;
        local_78 = psVar7;
        do {
          psVar10 = local_78;
          if ((byte)local_8c < 8) {
LAB_0012d18e:
            bVar21 = false;
          }
          else {
            if (iVar4 == 0) {
              pbVar8 = s->img_buffer;
              if (pbVar8 < s->img_buffer_end) {
LAB_0012d172:
                s->img_buffer = pbVar8 + 1;
                local_7c = (uint)*pbVar8;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar4 = (*(s->io).read)(s->io_user_data,(char *)local_78,s->buflen);
                  if (iVar4 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar10;
                    s->img_buffer_end = local_48;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar10 + iVar4;
                  }
                  pbVar8 = s->img_buffer;
                  goto LAB_0012d172;
                }
                local_7c = 0;
              }
              iVar4 = (local_7c & 0x7f) + 1;
              local_7c = local_7c >> 7;
              goto LAB_0012d18e;
            }
            bVar21 = (bool)(bVar11 & local_7c != 0);
            local_7c = (uint)(local_7c != 0);
          }
          psVar10 = local_78;
          if (!bVar21) {
            if ((char)local_90 == '\0') {
              if (bVar2) {
                uVar20 = 0;
                do {
                  psVar10 = s->img_buffer;
                  if (psVar10 < s->img_buffer_end) {
LAB_0012d275:
                    s->img_buffer = psVar10 + 1;
                    sVar3 = *psVar10;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
                      if (iVar6 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar7;
                        s->img_buffer_end = local_48;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar7;
                        s->img_buffer_end = psVar7 + iVar6;
                      }
                      psVar10 = s->img_buffer;
                      goto LAB_0012d275;
                    }
                    sVar3 = '\0';
                  }
                  local_a4[uVar20] = sVar3;
                  uVar20 = uVar20 + 1;
                } while (uVar12 != uVar20);
              }
              else {
                if ((uint)local_a0 != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/stb_image.h"
                                ,0x1465,
                                "stbi_uc *stbi__tga_load(stbi__context *, int *, int *, int *, int)"
                               );
                }
                uVar13 = stbi__get16le(s);
                local_a4[0] = (stbi_uc)((ulong)((uVar13 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
                local_a4[1] = (stbi_uc)((ulong)((uVar13 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
                local_a4[2] = (stbi_uc)((ulong)((uVar13 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
              }
            }
            else {
              if ((char)local_94 == '\b') {
                pbVar8 = s->img_buffer;
                if (s->img_buffer_end <= pbVar8) {
                  if (s->read_from_callbacks == 0) {
                    uVar13 = 0;
                    goto LAB_0012d34a;
                  }
                  iVar6 = (*(s->io).read)(s->io_user_data,(char *)local_78,s->buflen);
                  if (iVar6 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar10;
                    s->img_buffer_end = local_48;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar10 + iVar6;
                  }
                  pbVar8 = s->img_buffer;
                }
                s->img_buffer = pbVar8 + 1;
                uVar13 = (uint)*pbVar8;
              }
              else {
                uVar13 = stbi__get16le(s);
              }
LAB_0012d34a:
              if (local_6c <= uVar13) {
                uVar13 = 0;
              }
              memcpy(local_a4,local_68 + uVar13 * (uint)local_a0,local_60);
            }
          }
          puVar9 = local_88;
          memcpy(local_88 + (uint)local_a0 * (int)uVar18,local_a4,local_60);
          iVar4 = iVar4 + -1;
          uVar18 = uVar18 + 1;
          bVar11 = 1;
        } while (uVar18 != local_38);
      }
      if (bVar22 && y_00 != 0) {
        iVar4 = (uint)local_a0 * x_00;
        iVar6 = iVar4 * (y_00 - 1);
        uVar13 = 0;
        uVar12 = 0;
        do {
          if (x_00 != 0) {
            puVar15 = puVar9;
            iVar14 = iVar4 + 1;
            do {
              uVar1 = puVar15[uVar13];
              puVar15[uVar13] = puVar15[iVar6];
              puVar15[iVar6] = uVar1;
              puVar15 = puVar15 + 1;
              iVar14 = iVar14 + -1;
            } while (1 < iVar14);
          }
          iVar6 = iVar6 - iVar4;
          uVar13 = uVar13 + iVar4;
          bVar22 = uVar12 != y_00 - 1 >> 1;
          uVar12 = uVar12 + 1;
        } while (bVar22);
      }
      if (local_68 != (stbi_uc *)0x0) {
        free(local_68);
      }
    }
    if (((int)local_50 != 0 && 2 < (uint)local_a0) && (char)local_70 == '\0') {
      puVar15 = puVar9 + 2;
      uVar18 = local_50;
      do {
        uVar1 = puVar15[-2];
        puVar15[-2] = *puVar15;
        *puVar15 = uVar1;
        puVar15 = puVar15 + local_58;
        uVar12 = (int)uVar18 - 1;
        uVar18 = (ulong)uVar12;
      } while (uVar12 != 0);
    }
    if (local_3c != 0) {
      if ((uint)local_a0 != local_3c) {
        puVar9 = stbi__convert_format(puVar9,(uint)local_a0,local_3c,x_00,y_00);
        return puVar9;
      }
      return puVar9;
    }
    return puVar9;
  }
LAB_0012d49b:
  stbi__g_failure_reason = "outofmem";
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4];
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   tga_data = (unsigned char*)stbi__malloc( (size_t)tga_width * tga_height * tga_comp );
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc( tga_palette_len * tga_comp );
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}